

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhereState.hpp
# Opt level: O0

void __thiscall
linq::
WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/main.cpp:31:13),_int>
::Advance(WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_main_cpp:31:13),_int>
          *this)

{
  bool bVar1;
  byte local_21;
  int local_14;
  WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_main_cpp:31:13),_int>
  *local_10;
  WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_main_cpp:31:13),_int>
  *this_local;
  
  local_10 = this;
  IEnumerable<int>::Advance(&this->source);
  while( true ) {
    bVar1 = IEnumerable<int>::Valid(&this->source);
    local_21 = 0;
    if (bVar1) {
      local_14 = IEnumerable<int>::Current(&this->source);
      bVar1 = anon_class_1_0_00000001_for_filter::operator()
                        ((anon_class_1_0_00000001_for_filter *)&this->field_0x20,&local_14);
      local_21 = bVar1 ^ 0xff;
    }
    if ((local_21 & 1) == 0) break;
    IEnumerable<int>::Advance(&this->source);
  }
  return;
}

Assistant:

void Advance() final override 
			{
				source.Advance();

				while(source.Valid() && !filter(source.Current()))
					source.Advance();
			}